

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts_engine.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  HTS_Boolean HVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char **ppcVar6;
  char *fn;
  size_t num_voices;
  char *pcVar7;
  size_t sVar8;
  double dVar9;
  FILE *local_218;
  FILE *local_210;
  FILE *local_208;
  FILE *local_200;
  FILE *local_1f8;
  FILE *local_1f0;
  FILE *local_1e8;
  HTS_Engine engine;
  
  if (argc < 2) {
switchD_00101755_caseD_68:
    usage();
LAB_00101bd2:
    pcVar7 = "Error: Invalid option \'-v%c\'.\n";
LAB_00101cab:
    fprintf(_stderr,pcVar7);
  }
  else {
    HTS_Engine_initialize(&engine);
    ppcVar6 = (char **)malloc((ulong)(uint)argc << 3);
    num_voices = 0;
    iVar4 = 0;
    while (iVar4 < argc) {
      pcVar7 = argv[iVar4];
      iVar3 = iVar4;
      if (*pcVar7 == '-') {
        if (pcVar7[1] == 'm') {
          iVar3 = iVar4 + 1;
          pcVar7 = argv[(long)iVar4 + 1];
          ppcVar6[num_voices] = pcVar7;
          num_voices = num_voices + 1;
          if (*pcVar7 != '-') goto LAB_001016a4;
        }
        if (pcVar7[1] == 'h') goto switchD_00101755_caseD_68;
      }
LAB_001016a4:
      iVar4 = iVar3 + 1;
    }
    if (num_voices == 0) {
      fwrite("Error: HTS voice must be specified.\n",0x24,1,_stderr);
      free(ppcVar6);
      goto LAB_00101cbc;
    }
    HVar2 = HTS_Engine_load(&engine,ppcVar6,num_voices);
    if (HVar2 == '\x01') {
      free(ppcVar6);
      local_218 = (FILE *)0x0;
      local_210 = (FILE *)0x0;
      local_1e8 = (FILE *)0x0;
      local_208 = (FILE *)0x0;
      local_200 = (FILE *)0x0;
      local_1f8 = (FILE *)0x0;
      local_1f0 = (FILE *)0x0;
      pcVar7 = (char *)0x0;
LAB_0010171b:
      do {
        iVar4 = argc;
        ppcVar6 = argv;
        fn = pcVar7;
        argc = iVar4 + -1;
        if (argc == 0) goto LAB_00101a8d;
        pcVar7 = ppcVar6[1];
        argv = ppcVar6 + 1;
        if (*pcVar7 == '-') {
          switch(pcVar7[1]) {
          case 'a':
            dVar9 = atof(ppcVar6[2]);
            HTS_Engine_set_alpha(&engine,dVar9);
            break;
          case 'b':
            dVar9 = atof(ppcVar6[2]);
            HTS_Engine_set_beta(&engine,dVar9);
            break;
          default:
            pcVar7 = "Error: Invalid option \'-%c\'.\n";
            goto LAB_00101cab;
          case 'f':
            if (pcVar7[2] != 'm') {
              pcVar7 = "Error: Invalid option \'-f%c\'.\n";
              goto LAB_00101cab;
            }
            dVar9 = atof(ppcVar6[2]);
            HTS_Engine_add_half_tone(&engine,dVar9);
            break;
          case 'g':
            dVar9 = atof(ppcVar6[2]);
            HTS_Engine_set_volume(&engine,dVar9);
            break;
          case 'h':
            goto switchD_00101755_caseD_68;
          case 'i':
            uVar5 = atoi(ppcVar6[2]);
            if (num_voices != (long)(int)uVar5) goto LAB_00101cb2;
            argv = ppcVar6 + 2;
            for (sVar8 = 0; uVar5 != sVar8; sVar8 = sVar8 + 1) {
              ppcVar6 = argv + 1;
              argv = argv + 1;
              dVar9 = atof(*ppcVar6);
              HTS_Engine_set_duration_interpolation_weight(&engine,sVar8,dVar9);
              HTS_Engine_set_parameter_interpolation_weight(&engine,sVar8,0,dVar9);
              HTS_Engine_set_parameter_interpolation_weight(&engine,sVar8,1,dVar9);
              HTS_Engine_set_gv_interpolation_weight(&engine,sVar8,0,dVar9);
              HTS_Engine_set_gv_interpolation_weight(&engine,sVar8,1,dVar9);
            }
            pcVar7 = fn;
            argc = (iVar4 + -2) - (int)sVar8;
            goto LAB_0010171b;
          case 'j':
            cVar1 = pcVar7[2];
            if (cVar1 == 'p') {
LAB_00101903:
              sVar8 = 1;
            }
            else {
              if (cVar1 != 'm') {
                if (cVar1 == 'f') goto LAB_00101903;
                pcVar7 = "Error: Invalid option \'-j%c\'.\n";
                goto LAB_00101cab;
              }
              sVar8 = 0;
            }
            dVar9 = atof(ppcVar6[2]);
            HTS_Engine_set_gv_weight(&engine,sVar8,dVar9);
            break;
          case 'm':
            break;
          case 'o':
            switch(pcVar7[2]) {
            case 'd':
              local_218 = fopen(ppcVar6[2],"wt");
              break;
            default:
              pcVar7 = "Error: Invalid option \'-o%c\'.\n";
              goto LAB_00101cab;
            case 'f':
            case 'p':
              local_1e8 = fopen(ppcVar6[2],"wb");
              break;
            case 'l':
              local_208 = fopen(ppcVar6[2],"wb");
              break;
            case 'm':
              local_210 = fopen(ppcVar6[2],"wb");
              break;
            case 'r':
              local_1f8 = fopen(ppcVar6[2],"wb");
              break;
            case 't':
              local_1f0 = fopen(ppcVar6[2],"wt");
              break;
            case 'w':
              local_200 = fopen(ppcVar6[2],"wb");
            }
            break;
          case 'p':
            iVar3 = atoi(ppcVar6[2]);
            HTS_Engine_set_fperiod(&engine,(long)iVar3);
            break;
          case 'r':
            dVar9 = atof(ppcVar6[2]);
            HTS_Engine_set_speed(&engine,dVar9);
            break;
          case 's':
            iVar3 = atoi(ppcVar6[2]);
            HTS_Engine_set_sampling_frequency(&engine,(long)iVar3);
            break;
          case 'u':
            dVar9 = atof(ppcVar6[2]);
            HTS_Engine_set_msd_threshold(&engine,1,dVar9);
            break;
          case 'v':
            if (pcVar7[2] != 'p') goto LAB_00101bd2;
            HTS_Engine_set_phoneme_alignment_flag(&engine,'\x01');
            pcVar7 = fn;
            goto LAB_0010171b;
          case 'z':
            iVar3 = atoi(ppcVar6[2]);
            HTS_Engine_set_audio_buff_size(&engine,(long)iVar3);
          }
          pcVar7 = fn;
          argv = ppcVar6 + 2;
          argc = iVar4 + -2;
        }
      } while( true );
    }
    fwrite("Error: HTS voices cannot be loaded.\n",0x24,1,_stderr);
    free(ppcVar6);
  }
  goto LAB_00101cb2;
LAB_00101a8d:
  HVar2 = HTS_Engine_synthesize_from_fn(&engine,fn);
  if (HVar2 == '\x01') {
    if (local_1f0 != (FILE *)0x0) {
      HTS_Engine_save_information(&engine,(FILE *)local_1f0);
    }
    if (local_218 != (FILE *)0x0) {
      HTS_Engine_save_label(&engine,(FILE *)local_218);
    }
    if (local_1f8 != (FILE *)0x0) {
      HTS_Engine_save_generated_speech(&engine,(FILE *)local_1f8);
    }
    if (local_200 != (FILE *)0x0) {
      HTS_Engine_save_riff(&engine,(FILE *)local_200);
    }
    if (local_210 != (FILE *)0x0) {
      HTS_Engine_save_generated_parameter(&engine,0,(FILE *)local_210);
    }
    if (local_1e8 != (FILE *)0x0) {
      HTS_Engine_save_generated_parameter(&engine,1,(FILE *)local_1e8);
    }
    if (local_208 != (FILE *)0x0) {
      HTS_Engine_save_generated_parameter(&engine,2,(FILE *)local_208);
    }
    HTS_Engine_refresh(&engine);
    HTS_Engine_clear(&engine);
    if (local_218 != (FILE *)0x0) {
      fclose(local_218);
    }
    if (local_210 != (FILE *)0x0) {
      fclose(local_210);
    }
    if (local_1e8 != (FILE *)0x0) {
      fclose(local_1e8);
    }
    if (local_208 != (FILE *)0x0) {
      fclose(local_208);
    }
    if (local_200 != (FILE *)0x0) {
      fclose(local_200);
    }
    if (local_1f8 != (FILE *)0x0) {
      fclose(local_1f8);
    }
    if (local_1f0 != (FILE *)0x0) {
      fclose(local_1f0);
    }
    return 0;
  }
  fwrite("Error: waveform cannot be synthesized.\n",0x27,1,_stderr);
LAB_00101cb2:
  HTS_Engine_clear(&engine);
LAB_00101cbc:
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
   int i;
   double f;

   /* hts_engine API */
   HTS_Engine engine;

   /* HTS voices */
   size_t num_voices;
   char **fn_voices;

   /* input label file name */
   char *labfn = NULL;

   /* output file pointers */
   FILE *durfp = NULL, *mgcfp = NULL, *lf0fp = NULL, *lpffp = NULL, *wavfp = NULL, *rawfp = NULL, *tracefp = NULL;

   /* interpolation weights */
   size_t num_interpolation_weights;

   /* output usage */
   if (argc <= 1)
      usage();

   /* initialize hts_engine API */
   HTS_Engine_initialize(&engine);

   /* get HTS voice file names */
   num_voices = 0;
   fn_voices = (char **) malloc(argc * sizeof(char *));
   for (i = 0; i < argc; i++) {
      if (argv[i][0] == '-' && argv[i][1] == 'm')
         fn_voices[num_voices++] = argv[++i];
      if (argv[i][0] == '-' && argv[i][1] == 'h')
         usage();
   }
   if (num_voices == 0) {
      fprintf(stderr, "Error: HTS voice must be specified.\n");
      free(fn_voices);
      exit(1);
   }

   /* load HTS voices */
   if (HTS_Engine_load(&engine, fn_voices, num_voices) != TRUE) {
      fprintf(stderr, "Error: HTS voices cannot be loaded.\n");
      free(fn_voices);
      HTS_Engine_clear(&engine);
      exit(1);
   }
   free(fn_voices);

   /* get options */
   while (--argc) {
      if (**++argv == '-') {
         switch (*(*argv + 1)) {
         case 'v':
            switch (*(*argv + 2)) {
            case 'p':
               HTS_Engine_set_phoneme_alignment_flag(&engine, TRUE);
               break;
            default:
               fprintf(stderr, "Error: Invalid option '-v%c'.\n", *(*argv + 2));
               HTS_Engine_clear(&engine);
               exit(1);
            }
            break;
         case 'o':
            switch (*(*argv + 2)) {
            case 'w':
               wavfp = fopen(*++argv, "wb");
               break;
            case 'r':
               rawfp = fopen(*++argv, "wb");
               break;
            case 'd':
               durfp = fopen(*++argv, "wt");
               break;
            case 'm':
               mgcfp = fopen(*++argv, "wb");
               break;
            case 'f':
            case 'p':
               lf0fp = fopen(*++argv, "wb");
               break;
            case 'l':
               lpffp = fopen(*++argv, "wb");
               break;
            case 't':
               tracefp = fopen(*++argv, "wt");
               break;
            default:
               fprintf(stderr, "Error: Invalid option '-o%c'.\n", *(*argv + 2));
               HTS_Engine_clear(&engine);
               exit(1);
            }
            --argc;
            break;
         case 'h':
            usage();
            break;
         case 'm':
            argv++;             /* HTS voices were already loaded */
            --argc;
            break;
         case 's':
            HTS_Engine_set_sampling_frequency(&engine, (size_t) atoi(*++argv));
            --argc;
            break;
         case 'p':
            HTS_Engine_set_fperiod(&engine, (size_t) atoi(*++argv));
            --argc;
            break;
         case 'a':
            HTS_Engine_set_alpha(&engine, atof(*++argv));
            --argc;
            break;
         case 'b':
            HTS_Engine_set_beta(&engine, atof(*++argv));
            --argc;
            break;
         case 'r':
            HTS_Engine_set_speed(&engine, atof(*++argv));
            --argc;
            break;
         case 'f':
            switch (*(*argv + 2)) {
            case 'm':
               HTS_Engine_add_half_tone(&engine, atof(*++argv));
               break;
            default:
               fprintf(stderr, "Error: Invalid option '-f%c'.\n", *(*argv + 2));
               HTS_Engine_clear(&engine);
               exit(1);
            }
            --argc;
            break;
         case 'u':
            HTS_Engine_set_msd_threshold(&engine, 1, atof(*++argv));
            --argc;
            break;
         case 'i':
            num_interpolation_weights = atoi(*++argv);
            argc--;
            if (num_interpolation_weights != num_voices) {
               HTS_Engine_clear(&engine);
               exit(1);
            }
            for (i = 0; i < num_interpolation_weights; i++) {
               f = atof(*++argv);
               argc--;
               HTS_Engine_set_duration_interpolation_weight(&engine, i, f);
               HTS_Engine_set_parameter_interpolation_weight(&engine, i, 0, f);
               HTS_Engine_set_parameter_interpolation_weight(&engine, i, 1, f);
               HTS_Engine_set_gv_interpolation_weight(&engine, i, 0, f);
               HTS_Engine_set_gv_interpolation_weight(&engine, i, 1, f);
            }
            break;
         case 'j':
            switch (*(*argv + 2)) {
            case 'm':
               HTS_Engine_set_gv_weight(&engine, 0, atof(*++argv));
               break;
            case 'f':
            case 'p':
               HTS_Engine_set_gv_weight(&engine, 1, atof(*++argv));
               break;
            default:
               fprintf(stderr, "Error: Invalid option '-j%c'.\n", *(*argv + 2));
               HTS_Engine_clear(&engine);
               exit(1);
            }
            --argc;
            break;
         case 'g':
            HTS_Engine_set_volume(&engine, atof(*++argv));
            --argc;
            break;
         case 'z':
            HTS_Engine_set_audio_buff_size(&engine, (size_t) atoi(*++argv));
            --argc;
            break;
         default:
            fprintf(stderr, "Error: Invalid option '-%c'.\n", *(*argv + 1));
            HTS_Engine_clear(&engine);
            exit(1);
         }
      } else {
         labfn = *argv;
      }
   }

   /* synthesize */
   if (HTS_Engine_synthesize_from_fn(&engine, labfn) != TRUE) {
      fprintf(stderr, "Error: waveform cannot be synthesized.\n");
      HTS_Engine_clear(&engine);
      exit(1);
   }

   /* output */
   if (tracefp != NULL)
      HTS_Engine_save_information(&engine, tracefp);
   if (durfp != NULL)
      HTS_Engine_save_label(&engine, durfp);
   if (rawfp)
      HTS_Engine_save_generated_speech(&engine, rawfp);
   if (wavfp)
      HTS_Engine_save_riff(&engine, wavfp);
   if (mgcfp)
      HTS_Engine_save_generated_parameter(&engine, 0, mgcfp);
   if (lf0fp)
      HTS_Engine_save_generated_parameter(&engine, 1, lf0fp);
   if (lpffp)
      HTS_Engine_save_generated_parameter(&engine, 2, lpffp);

   /* reset */
   HTS_Engine_refresh(&engine);

   /* free memory */
   HTS_Engine_clear(&engine);

   /* close files */
   if (durfp != NULL)
      fclose(durfp);
   if (mgcfp != NULL)
      fclose(mgcfp);
   if (lf0fp != NULL)
      fclose(lf0fp);
   if (lpffp != NULL)
      fclose(lpffp);
   if (wavfp != NULL)
      fclose(wavfp);
   if (rawfp != NULL)
      fclose(rawfp);
   if (tracefp != NULL)
      fclose(tracefp);

   return 0;
}